

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::
default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
::default_disp_impl_t
          (default_disp_impl_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t,_so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t,_so_5::env_infrastructures::simple_not_mtsafe::impl::disp_ds_name_parts_t>
           *this,outliving_reference_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
                 *event_queue,
          outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
          *activity_tracker)

{
  event_queue_impl_t *peVar1;
  
  peVar1 = event_queue->m_ptr;
  so_5::dispatcher_t::dispatcher_t((dispatcher_t *)this);
  (this->
  super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  ).m_event_queue.m_ptr = peVar1;
  (this->
  super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  ).m_thread_id._M_thread = 0;
  (this->
  super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  ).m_agents_bound.super___atomic_base<unsigned_long>._M_i = 0;
  (this->
  super_default_disp_impl_basis_t<so_5::env_infrastructures::simple_not_mtsafe::impl::event_queue_impl_t>
  ).super_dispatcher_t._vptr_dispatcher_t = (_func_int **)&PTR__default_disp_impl_t_0028c700;
  stats::manually_registered_source_t::manually_registered_source_t
            (&(this->m_data_source).super_manually_registered_source_t);
  (this->m_data_source).super_manually_registered_source_t.super_source_t._vptr_source_t =
       (_func_int **)&PTR_distribute_0028c758;
  (this->m_data_source).m_dispatcher.m_ptr = this;
  (this->m_data_source).m_base_prefix.m_value[0] = '\0';
  (this->m_activity_tracker).m_ptr = activity_tracker->m_ptr;
  return;
}

Assistant:

default_disp_impl_t(
			outliving_reference_t< EVENT_QUEUE_TYPE > event_queue,
			outliving_reference_t< ACTIVITY_TRACKER > activity_tracker )
			:	default_disp_impl_basis_t< EVENT_QUEUE_TYPE >( std::move(event_queue) )
			,	m_data_source( outliving_mutable( *this ) )
			,	m_activity_tracker( std::move(activity_tracker) )
			{}